

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_getobjtypetag(HSQOBJECT *o,SQUserPointer *typetag)

{
  SQObjectType SVar1;
  long lVar2;
  SQObjectValue *pSVar3;
  
  SVar1 = o->_type;
  if (SVar1 == OT_CLASS) {
    pSVar3 = &o->_unVal;
  }
  else {
    if (SVar1 == OT_USERDATA) {
      pSVar3 = &o->_unVal;
      lVar2 = 0x48;
      goto LAB_0014347d;
    }
    if (SVar1 != OT_INSTANCE) {
      return -1;
    }
    pSVar3 = (SQObjectValue *)&((o->_unVal).pTable)->_firstfree;
  }
  lVar2 = 0x1a0;
LAB_0014347d:
  *typetag = *(SQUserPointer *)
              ((long)&(pSVar3->pTable->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                      _vptr_SQRefCounted + lVar2);
  return 0;
}

Assistant:

SQRESULT sq_getobjtypetag(const HSQOBJECT *o,SQUserPointer * typetag)
{
  switch(sq_type(*o)) {
    case OT_INSTANCE: *typetag = _instance(*o)->_class->_typetag; break;
    case OT_USERDATA: *typetag = _userdata(*o)->_typetag; break;
    case OT_CLASS:    *typetag = _class(*o)->_typetag; break;
    default: return SQ_ERROR;
  }
  return SQ_OK;
}